

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdpfor.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::SIMDPFor::decodeArray
          (SIMDPFor *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  uint *in_RSI;
  size_t *in_RDI;
  ulong *in_R8;
  size_t unaff_retaddr;
  uint32_t *in_stack_00000008;
  size_t thisnvalue;
  size_t totalnvalue;
  uint32_t *finalin;
  ulong local_40;
  uint *local_18;
  uint32_t *in_stack_fffffffffffffff8;
  
  local_18 = in_RSI + 1;
  *in_R8 = (ulong)*in_RSI;
  if (*in_R8 != 0) {
    local_40 = 0;
    while (local_40 < *in_R8) {
      local_40 = *in_R8;
      local_18 = __decodeArray((SIMDPFor *)thisnvalue,in_stack_00000008,unaff_retaddr,
                               in_stack_fffffffffffffff8,in_RDI);
    }
    *in_R8 = local_40;
  }
  return local_18;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t len,
                              uint32_t *out, size_t &nvalue) override {
    nvalue = *in++;
    if (nvalue == 0)
      return in;
#ifndef NDEBUG
    const uint32_t *const initin = in;
#endif
    const uint32_t *const finalin = in + len;
    size_t totalnvalue(0);
    while (totalnvalue < nvalue) {
      size_t thisnvalue = nvalue - totalnvalue;
#ifndef NDEBUG
      const uint32_t *const befin(in);
#endif
      assert(finalin <= len + in);
      in = __decodeArray(in, finalin - in, out, thisnvalue);
      assert(in > befin);
      assert(in <= finalin);
      out += thisnvalue;
      totalnvalue += thisnvalue;
      assert(totalnvalue <= nvalue);
    }
    assert(in <= len + initin);
    assert(in <= finalin);
    nvalue = totalnvalue;
    return in;
  }